

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChNodeSPH::ChNodeSPH(ChNodeSPH *this)

{
  ChCollisionModelBullet *this_00;
  double dVar1;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x108);
  (this->super_ChNodeXYZ).super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_00b04a88;
  ChNodeXYZ::ChNodeXYZ(&this->super_ChNodeXYZ,&PTR_construction_vtable_128__00b0f898);
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x108 = 0xb0f7d8;
  (this->super_ChNodeXYZ).super_ChLoadableUVW = (ChLoadableUVW)0xb0f508;
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x50 = 0xb0f658;
  *(undefined8 *)&this->field_0x68 = 0xb0f700;
  this->container = (ChMatterSPH *)0x0;
  ChVariablesNode::ChVariablesNode(&this->variables);
  dVar1 = DAT_00b689a0;
  (this->UserForce).m_data[0] = VNULL;
  (this->UserForce).m_data[1] = dVar1;
  (this->UserForce).m_data[2] = DAT_00b689a8;
  this->volume = 0.01;
  this->h_rad = 0.1;
  this->coll_rad = 0.001;
  this->pressure = 0.0;
  this_00 = (ChCollisionModelBullet *)::operator_new(0x68);
  collision::ChCollisionModelBullet::ChCollisionModelBullet(this_00);
  this->collision_model = (ChCollisionModel *)this_00;
  (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x16])
            (this_00,&(this->super_ChNodeXYZ).field_0x50);
  (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(0x3f847ae147ae147b,this);
  dVar1 = (double)(**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(this);
  this->density = dVar1 / this->volume;
  return;
}

Assistant:

ChNodeSPH::ChNodeSPH() : container(nullptr), UserForce(VNULL), volume(0.01), h_rad(0.1), coll_rad(0.001), pressure(0) {
    collision_model = new ChCollisionModelBullet;
    collision_model->SetContactable(this);

    SetMass(0.01);
    density = GetMass() / volume;
}